

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O1

int cmListFileLexer_SetString(cmListFileLexer *lexer,char *text)

{
  yyguts_t_conflict *yyg;
  size_t sVar1;
  char *__dest;
  int iVar2;
  
  cmListFileLexerDestroy(lexer);
  iVar2 = 1;
  if (text != (char *)0x0) {
    sVar1 = strlen(text);
    __dest = (char *)malloc((long)((int)sVar1 + 1));
    lexer->string_buffer = __dest;
    if (__dest == (char *)0x0) {
      iVar2 = 0;
    }
    else {
      strcpy(__dest,text);
      lexer->string_position = __dest;
      lexer->string_left = (int)sVar1;
    }
  }
  if ((lexer->file != (FILE *)0x0) || (lexer->string_buffer != (char *)0x0)) {
    cmListFileLexer_yylex_init(&lexer->scanner);
    *(cmListFileLexer **)lexer->scanner = lexer;
  }
  return iVar2;
}

Assistant:

int cmListFileLexer_SetString(cmListFileLexer* lexer, const char* text)
{
  int result = 1;
  cmListFileLexerDestroy(lexer);
  if (text) {
    int length = (int)strlen(text);
    lexer->string_buffer = (char*)malloc(length + 1);
    if (lexer->string_buffer) {
      strcpy(lexer->string_buffer, text);
      lexer->string_position = lexer->string_buffer;
      lexer->string_left = length;
    } else {
      result = 0;
    }
  }
  cmListFileLexerInit(lexer);
  return result;
}